

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  string *psVar1;
  pointer *this;
  char *__s;
  wostream *pwVar2;
  ostream *poVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  size_type sVar7;
  byte *pbVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  wstring local_308;
  string local_2e8;
  allocator<wchar_t> local_2c1;
  undefined1 local_2c0 [8];
  wstring test34;
  size_t i;
  undefined1 local_278 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> test;
  wstring local_240;
  wstring local_220;
  wstring local_200;
  wstring local_1e0;
  string local_1c0;
  wstring local_1a0;
  string local_180;
  wstring local_160 [8];
  wstring decompressWStr;
  string decompressStr;
  wstring compressWStr;
  string compressStr;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  wstring input;
  LZString encoder;
  char **argv_local;
  int argc_local;
  
  if (argc == 2) {
    lzstring::LZString::LZString((LZString *)((long)&input.field_2 + 8));
    __s = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,__s,&local_c9);
    lzstring::to_wstring((wstring *)local_a8,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    std::__cxx11::string::string((string *)((long)&compressWStr.field_2 + 8));
    std::__cxx11::wstring::wstring((wstring *)(decompressStr.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)((long)&decompressWStr.field_2 + 8));
    std::__cxx11::wstring::wstring(local_160);
    pwVar2 = std::operator<<((wostream *)&std::wcout,"str: ");
    pwVar2 = std::operator<<(pwVar2,(wstring *)local_a8);
    std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"[base64]");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    lzstring::LZString::CompressToBase64
              (&local_180,(LZString *)((long)&input.field_2 + 8),(wstring *)local_a8);
    psVar1 = (string *)((long)&compressWStr.field_2 + 8);
    std::__cxx11::string::operator=((string *)psVar1,(string *)&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    lzstring::LZString::DeCompressFromBase64
              (&local_1a0,(LZString *)((long)&input.field_2 + 8),psVar1);
    std::__cxx11::wstring::operator=(local_160,(wstring *)&local_1a0);
    std::__cxx11::wstring::~wstring((wstring *)&local_1a0);
    poVar3 = std::operator<<((ostream *)&std::cout,"compress: ");
    poVar3 = std::operator<<(poVar3,(string *)((long)&compressWStr.field_2 + 8));
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pwVar2 = std::operator<<((wostream *)&std::wcout,"uncompress: ");
    pwVar2 = std::operator<<(pwVar2,local_160);
    std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"origin size: ");
    uVar4 = std::__cxx11::wstring::size();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Compress size: ");
    uVar4 = std::__cxx11::string::size();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"rate: ");
    uVar5 = std::__cxx11::string::size();
    auVar9._8_4_ = (int)((ulong)uVar5 >> 0x20);
    auVar9._0_8_ = uVar5;
    auVar9._12_4_ = 0x45300000;
    uVar6 = std::__cxx11::wstring::size();
    auVar14._8_4_ = (int)((ulong)uVar6 >> 0x20);
    auVar14._0_8_ = uVar6;
    auVar14._12_4_ = 0x45300000;
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,((auVar9._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) /
                               ((auVar14._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)));
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"-------------------------------------------");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"[URI]");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    lzstring::LZString::CompressToEncodedURIComponent
              (&local_1c0,(LZString *)((long)&input.field_2 + 8),(wstring *)local_a8);
    psVar1 = (string *)((long)&compressWStr.field_2 + 8);
    std::__cxx11::string::operator=((string *)psVar1,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    lzstring::LZString::DeCompressFromEncodedURIComponent
              (&local_1e0,(LZString *)((long)&input.field_2 + 8),psVar1);
    std::__cxx11::wstring::operator=(local_160,(wstring *)&local_1e0);
    std::__cxx11::wstring::~wstring((wstring *)&local_1e0);
    poVar3 = std::operator<<((ostream *)&std::cout,"compress: ");
    poVar3 = std::operator<<(poVar3,(string *)((long)&compressWStr.field_2 + 8));
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pwVar2 = std::operator<<((wostream *)&std::wcout,"uncompress: ");
    pwVar2 = std::operator<<(pwVar2,local_160);
    std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"origin size: ");
    uVar4 = std::__cxx11::wstring::size();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Compress size: ");
    uVar4 = std::__cxx11::string::size();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"rate: ");
    uVar5 = std::__cxx11::string::size();
    auVar10._8_4_ = (int)((ulong)uVar5 >> 0x20);
    auVar10._0_8_ = uVar5;
    auVar10._12_4_ = 0x45300000;
    uVar6 = std::__cxx11::wstring::size();
    auVar15._8_4_ = (int)((ulong)uVar6 >> 0x20);
    auVar15._0_8_ = uVar6;
    auVar15._12_4_ = 0x45300000;
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,((auVar10._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) /
                               ((auVar15._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)));
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"-------------------------------------------");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"[UTF16]");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    lzstring::LZString::CompressToUTF16
              (&local_200,(LZString *)((long)&input.field_2 + 8),(wstring *)local_a8);
    std::__cxx11::wstring::operator=
              ((wstring *)(decompressStr.field_2._M_local_buf + 8),(wstring *)&local_200);
    std::__cxx11::wstring::~wstring((wstring *)&local_200);
    lzstring::LZString::DeCompressFromUTF16
              (&local_220,(LZString *)((long)&input.field_2 + 8),
               (wstring *)(decompressStr.field_2._M_local_buf + 8));
    std::__cxx11::wstring::operator=(local_160,(wstring *)&local_220);
    std::__cxx11::wstring::~wstring((wstring *)&local_220);
    pwVar2 = std::operator<<((wostream *)&std::wcout,"uncompress: ");
    pwVar2 = std::operator<<(pwVar2,local_160);
    std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"origin size: ");
    uVar4 = std::__cxx11::wstring::size();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Compress size: ");
    uVar4 = std::__cxx11::wstring::size();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"rate: ");
    uVar5 = std::__cxx11::wstring::size();
    auVar11._8_4_ = (int)((ulong)uVar5 >> 0x20);
    auVar11._0_8_ = uVar5;
    auVar11._12_4_ = 0x45300000;
    uVar6 = std::__cxx11::wstring::size();
    auVar16._8_4_ = (int)((ulong)uVar6 >> 0x20);
    auVar16._0_8_ = uVar6;
    auVar16._12_4_ = 0x45300000;
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,((auVar11._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) /
                               ((auVar16._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)));
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"-------------------------------------------");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"[LZ String]");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    lzstring::LZString::Compress
              (&local_240,(LZString *)((long)&input.field_2 + 8),(wstring *)local_a8);
    std::__cxx11::wstring::operator=
              ((wstring *)(decompressStr.field_2._M_local_buf + 8),(wstring *)&local_240);
    std::__cxx11::wstring::~wstring((wstring *)&local_240);
    lzstring::LZString::DeCompress
              ((wstring *)
               &test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(LZString *)((long)&input.field_2 + 8),
               (wstring *)(decompressStr.field_2._M_local_buf + 8));
    this = &test.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::wstring::operator=(local_160,(wstring *)this);
    std::__cxx11::wstring::~wstring((wstring *)this);
    pwVar2 = std::operator<<((wostream *)&std::wcout,"uncompress: ");
    pwVar2 = std::operator<<(pwVar2,local_160);
    std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"origin size: ");
    uVar4 = std::__cxx11::wstring::size();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Compress size: ");
    uVar4 = std::__cxx11::wstring::size();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"rate: ");
    uVar5 = std::__cxx11::wstring::size();
    auVar12._8_4_ = (int)((ulong)uVar5 >> 0x20);
    auVar12._0_8_ = uVar5;
    auVar12._12_4_ = 0x45300000;
    uVar6 = std::__cxx11::wstring::size();
    auVar17._8_4_ = (int)((ulong)uVar6 >> 0x20);
    auVar17._0_8_ = uVar6;
    auVar17._12_4_ = 0x45300000;
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,((auVar12._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) /
                               ((auVar17._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)));
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"-------------------------------------------");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"[LZ String uint8 array]");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_278);
    lzstring::LZString::CompressToUint8Array
              ((LZString *)((long)&input.field_2 + 8),(wstring *)local_a8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_278);
    lzstring::LZString::DeCompressFromUint8Array_abi_cxx11_
              ((wstring *)&i,(LZString *)((long)&input.field_2 + 8),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_278);
    std::__cxx11::wstring::operator=(local_160,(wstring *)&i);
    std::__cxx11::wstring::~wstring((wstring *)&i);
    std::operator<<((ostream *)&std::cout,"compress: ");
    test34.field_2._8_8_ = 0;
    while( true ) {
      uVar5 = test34.field_2._8_8_;
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_278);
      if (sVar7 <= (ulong)uVar5) break;
      pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_278,
                          test34.field_2._8_8_);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)*pbVar8);
      std::operator<<(poVar3," ");
      test34.field_2._8_8_ = test34.field_2._8_8_ + 1;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    pwVar2 = std::operator<<((wostream *)&std::wcout,"uncompress: ");
    pwVar2 = std::operator<<(pwVar2,local_160);
    std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"origin size: ");
    uVar4 = std::__cxx11::wstring::size();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Compress size: ");
    sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_278);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar7);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"rate: ");
    sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_278);
    auVar13._8_4_ = (int)(sVar7 >> 0x20);
    auVar13._0_8_ = sVar7;
    auVar13._12_4_ = 0x45300000;
    uVar5 = std::__cxx11::wstring::size();
    auVar18._8_4_ = (int)((ulong)uVar5 >> 0x20);
    auVar18._0_8_ = uVar5;
    auVar18._12_4_ = 0x45300000;
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,((auVar13._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0)) /
                               ((auVar18._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)));
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"-------------------------------------------");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_2c0,L"😘",&local_2c1)
    ;
    std::allocator<wchar_t>::~allocator(&local_2c1);
    lzstring::LZString::CompressToBase64
              (&local_2e8,(LZString *)((long)&input.field_2 + 8),(wstring *)local_2c0);
    psVar1 = (string *)((long)&compressWStr.field_2 + 8);
    std::__cxx11::string::operator=((string *)psVar1,(string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    lzstring::LZString::DeCompressFromBase64
              (&local_308,(LZString *)((long)&input.field_2 + 8),psVar1);
    std::__cxx11::wstring::operator=(local_160,(wstring *)&local_308);
    std::__cxx11::wstring::~wstring((wstring *)&local_308);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)((long)&compressWStr.field_2 + 8));
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pwVar2 = std::operator<<((wostream *)&std::wcout,local_160);
    std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
    system("PAUSE");
    std::__cxx11::wstring::~wstring((wstring *)local_2c0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_278);
    std::__cxx11::wstring::~wstring(local_160);
    std::__cxx11::string::~string((string *)((long)&decompressWStr.field_2 + 8));
    std::__cxx11::wstring::~wstring((wstring *)(decompressStr.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)((long)&compressWStr.field_2 + 8));
    std::__cxx11::wstring::~wstring((wstring *)local_a8);
    lzstring::LZString::~LZString((LZString *)((long)&input.field_2 + 8));
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
  if (argc == 2)
  {
    lzstring::LZString encoder;
    std::wstring input(lzstring::to_wstring(argv[1]));
    std::string compressStr;
    std::wstring compressWStr;
    std::string decompressStr;
    std::wstring decompressWStr;

    std::wcout << "str: " << input << std::endl;

    std::cout << "[base64]" << std::endl;
    compressStr = encoder.CompressToBase64(input);
    decompressWStr = encoder.DeCompressFromBase64(compressStr);
    std::cout << "compress: " << compressStr << std::endl;
    std::wcout << "uncompress: " << decompressWStr << std::endl;
    std::cout << "origin size: " << input.size() << std::endl;
    std::cout << "Compress size: " << compressStr.size() << std::endl;
    std::cout << "rate: " << (double(compressStr.size())) / input.size() << std::endl;

    std::cout << "-------------------------------------------" << std::endl;
    std::cout << "[URI]" << std::endl;
    compressStr = encoder.CompressToEncodedURIComponent(input);
    decompressWStr = encoder.DeCompressFromEncodedURIComponent(compressStr);
    std::cout << "compress: " << compressStr << std::endl;
    std::wcout << "uncompress: " << decompressWStr << std::endl;
    std::cout << "origin size: " << input.size() << std::endl;
    std::cout << "Compress size: " << compressStr.size() << std::endl;
    std::cout << "rate: " << (double(compressStr.size())) / input.size() << std::endl;

    std::cout << "-------------------------------------------" << std::endl;
    std::cout << "[UTF16]" << std::endl;
    compressWStr = encoder.CompressToUTF16(input);
    decompressWStr = encoder.DeCompressFromUTF16(compressWStr);
    //std::wcout << "compress: " << compressWStr << std::endl;
    std::wcout << "uncompress: " << decompressWStr << std::endl;
    std::cout << "origin size: " << input.size() << std::endl;
    std::cout << "Compress size: " << compressWStr.size() << std::endl;
    std::cout << "rate: " << (double(compressWStr.size())) / input.size() << std::endl;

    std::cout << "-------------------------------------------" << std::endl;
    std::cout << "[LZ String]" << std::endl;
    compressWStr = encoder.Compress(input);
    decompressWStr = encoder.DeCompress(compressWStr);
    //std::wcout << "compress: " << compressWStr << std::endl;
    std::wcout << "uncompress: " << decompressWStr << std::endl;
    std::cout << "origin size: " << input.size() << std::endl;
    std::cout << "Compress size: " << compressWStr.size() << std::endl;
    std::cout << "rate: " << (double(compressWStr.size())) / input.size() << std::endl;

    std::cout << "-------------------------------------------" << std::endl;
    std::cout << "[LZ String uint8 array]" << std::endl;
    std::vector<uint8_t> test;
    encoder.CompressToUint8Array(input, test);
    decompressWStr = encoder.DeCompressFromUint8Array(test);
    std::cout << "compress: ";
    for (size_t i = 0; i < test.size(); i++)
    {
      std::cout << (int)test[i] << " ";
    }
    std::cout << std::endl;
    std::wcout << "uncompress: " << decompressWStr << std::endl;
    std::cout << "origin size: " << input.size() << std::endl;
    std::cout << "Compress size: " << test.size() << std::endl;
    std::cout << "rate: " << (double(test.size())) / input.size() << std::endl;

    std::cout << "-------------------------------------------" << std::endl;
    std::wstring test34 = L"😘";
    compressStr = encoder.CompressToBase64(test34);
    decompressWStr = encoder.DeCompressFromBase64(compressStr);
    std::cout << compressStr << std::endl;
    std::wcout << decompressWStr << std::endl;
    system("PAUSE");
  }
}